

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_item_use_handling.hpp
# Opt level: O3

uint32_t PatchImproveItemUseHandling::inject_pre_use_table(ROM *rom,World *world)

{
  int iVar1;
  uint32_t uVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  Code pre_use_table;
  string local_c8;
  Code local_a8;
  
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (world->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(world->_items)._M_t._M_impl.super__Rb_tree_header;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      iVar1 = *(int *)&p_Var3[1]._M_parent[1]._M_right;
      if (iVar1 != 0) {
        local_c8._M_dataplus._M_p = (pointer)&PTR_getXn_00262cd8;
        local_c8._M_string_length._4_4_ = 2;
        local_c8._M_string_length._0_4_ = iVar1;
        md::Code::jmp(&local_a8,(Param *)&local_c8);
        md::Code::add_byte(&local_a8,*(uint8_t *)&(p_Var3[1]._M_parent)->_M_parent);
        md::Code::add_byte(&local_a8,0xff);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  md::Code::nop(&local_a8,3);
  md::Code::add_byte(&local_a8,0xff);
  md::Code::add_byte(&local_a8,0xff);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  uVar2 = md::ROM::inject_code(rom,&local_a8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_a8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8._pending_branches._M_t);
  if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar2;
}

Assistant:

static uint32_t inject_pre_use_table(md::ROM& rom, const World& world)
    {
        md::Code pre_use_table;
        for(auto& [id, item] : world.items())
        {
            if(!item->pre_use_address())
                continue;

            pre_use_table.jmp(item->pre_use_address());
            pre_use_table.add_byte(item->id());
            pre_use_table.add_byte(0xFF);
        }

        pre_use_table.nop(3);
        pre_use_table.add_byte(0xFF);
        pre_use_table.add_byte(0xFF);

        return rom.inject_code(pre_use_table);
    }